

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

void __thiscall jsonip::detail::struct_helper<P>::struct_helper(struct_helper<P> *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_struct_helper_base).accessors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_struct_helper_base).super_helper._vptr_helper =
       (_func_int **)&PTR__struct_helper_base_00113bd0;
  boost::mpl::for_each<boost::mpl::range_c<int,0,2>,jsonip::detail::struct_helper<P>::initializer>
            ((initializer)this,(range_c<int,_0,_2> *)0x0);
  return;
}

Assistant:

struct_helper()
        {
            boost::mpl::for_each<range_t>(initializer(*this));
        }